

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O3

bignum_t<10> __thiscall bignum_t<10>::operator/(bignum_t<10> *this,long l)

{
  bignum_t<10> bVar1;
  bignum_t<10> bl;
  undefined2 local_40;
  undefined2 uStack_3e;
  undefined1 uStack_3c;
  undefined5 uStack_3b;
  char local_32 [4];
  undefined1 local_2e;
  
  local_32[0] = '\n';
  local_32[1] = '\0';
  local_2e = 0;
  CVmObjBigNum::set_int_val(local_32,l);
  local_40 = 10;
  uStack_3c = 0;
  CVmObjBigNum::compute_quotient_into((char *)&local_40,(char *)0x0,this->ext,local_32);
  bVar1.ext[0] = (undefined1)local_40;
  bVar1.ext[1] = local_40._1_1_;
  bVar1.ext[2] = (undefined1)uStack_3e;
  bVar1.ext[3] = uStack_3e._1_1_;
  bVar1.ext[4] = uStack_3c;
  bVar1.ext[5] = (undefined1)uStack_3b;
  bVar1.ext[6] = uStack_3b._1_1_;
  bVar1.ext[7] = uStack_3b._2_1_;
  bVar1.ext[8] = uStack_3b._3_1_;
  bVar1.ext[9] = uStack_3b._4_1_;
  return (bignum_t<10>)bVar1.ext;
}

Assistant:

bignum_t operator /(long l) const
    {
        bignum_t<prec> bl(l);
        return *this / bl;
    }